

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int pagerPagecount(Pager *pPager,Pgno *pnPage)

{
  Wal *pWVar1;
  sqlite3_io_methods *psVar2;
  int iVar3;
  uint uVar4;
  i64 n;
  sqlite3_int64 local_18;
  
  pWVar1 = pPager->pWal;
  if (((pWVar1 == (Wal *)0x0) || (pWVar1->readLock < 0)) ||
     (uVar4 = (pWVar1->hdr).nPage, uVar4 == 0)) {
    psVar2 = pPager->fd->pMethods;
    if (psVar2 == (sqlite3_io_methods *)0x0) {
      uVar4 = 0;
      goto LAB_0012803e;
    }
    local_18 = 0;
    iVar3 = (*psVar2->xFileSize)(pPager->fd,&local_18);
    if (iVar3 != 0) {
      return iVar3;
    }
    uVar4 = (uint)((local_18 + pPager->pageSize + -1) / (long)pPager->pageSize);
  }
  if (pPager->mxPgno < uVar4) {
    pPager->mxPgno = uVar4;
  }
LAB_0012803e:
  *pnPage = uVar4;
  return 0;
}

Assistant:

static int pagerPagecount(Pager *pPager, Pgno *pnPage){
  Pgno nPage;                     /* Value to return via *pnPage */

  /* Query the WAL sub-system for the database size. The WalDbsize()
  ** function returns zero if the WAL is not open (i.e. Pager.pWal==0), or
  ** if the database size is not available. The database size is not
  ** available from the WAL sub-system if the log file is empty or
  ** contains no valid committed transactions.
  */
  assert( pPager->eState==PAGER_OPEN );
  assert( pPager->eLock>=SHARED_LOCK );
  assert( isOpen(pPager->fd) );
  assert( pPager->tempFile==0 );
  nPage = sqlite3WalDbsize(pPager->pWal);

  /* If the number of pages in the database is not available from the
  ** WAL sub-system, determine the page counte based on the size of
  ** the database file.  If the size of the database file is not an
  ** integer multiple of the page-size, round up the result.
  */
  if( nPage==0 && ALWAYS(isOpen(pPager->fd)) ){
    i64 n = 0;                    /* Size of db file in bytes */
    int rc = sqlite3OsFileSize(pPager->fd, &n);
    if( rc!=SQLITE_OK ){
      return rc;
    }
    nPage = (Pgno)((n+pPager->pageSize-1) / pPager->pageSize);
  }

  /* If the current number of pages in the file is greater than the
  ** configured maximum pager number, increase the allowed limit so
  ** that the file can be read.
  */
  if( nPage>pPager->mxPgno ){
    pPager->mxPgno = (Pgno)nPage;
  }

  *pnPage = nPage;
  return SQLITE_OK;
}